

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Allocator *pAVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  pointer pMVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int *piVar19;
  int iVar20;
  long lVar21;
  void *pvVar22;
  Mat *pMVar23;
  long lVar24;
  Mat *_elemsize;
  void *pvVar25;
  ulong uVar26;
  int h;
  long lVar27;
  int iVar28;
  int _woffset;
  int _hoffset;
  int _outw;
  int _outh;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  ulong local_140;
  int _outc;
  int _outd;
  int _coffset;
  Mat *local_110;
  ulong local_108;
  Mat m_1;
  int _doffset;
  ulong local_b0;
  ulong local_a8;
  long local_a0;
  ulong local_98;
  long local_90;
  Mat m_2;
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  local_a8 = CONCAT44(local_a8._4_4_,bottom_blob->d);
  iVar3 = bottom_blob->c;
  local_108 = (ulong)(uint)bottom_blob->dims;
  _elemsize = (Mat *)bottom_blob->elemsize;
  _outw = -1;
  _outh = -1;
  _outd = -1;
  local_110 = _elemsize;
  if (((this->starts_expr)._M_string_length != 0) && ((this->ends_expr)._M_string_length != 0)) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&bottom_blobs,1,(allocator_type *)&m_1);
    pMVar13 = bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start != bottom_blob) {
      piVar19 = bottom_blob->refcount;
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + 1;
        UNLOCK();
      }
      piVar19 = (bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->refcount;
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if ((bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
            if ((bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->data != (void *)0x0) {
              free((bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
          }
          else {
            (**(code **)(*(long *)(bottom_blobs.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start)->allocator + 0x18))();
          }
        }
      }
      pMVar13->cstep = 0;
      pMVar13->data = (void *)0x0;
      pMVar13->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
      pMVar13->dims = 0;
      pMVar13->w = 0;
      pMVar13->h = 0;
      pMVar13->d = 0;
      pMVar13->c = 0;
      piVar19 = bottom_blob->refcount;
      pMVar13->data = bottom_blob->data;
      pMVar13->refcount = piVar19;
      pMVar13->elemsize = bottom_blob->elemsize;
      pMVar13->elempack = bottom_blob->elempack;
      pMVar13->allocator = bottom_blob->allocator;
      iVar18 = bottom_blob->w;
      iVar14 = bottom_blob->h;
      iVar15 = bottom_blob->d;
      pMVar13->dims = bottom_blob->dims;
      pMVar13->w = iVar18;
      pMVar13->h = iVar14;
      pMVar13->d = iVar15;
      pMVar13->c = bottom_blob->c;
      pMVar13->cstep = bottom_blob->cstep;
    }
    piVar19 = &_hoffset;
    pMVar23 = (Mat *)&_doffset;
    eval_crop_expr(this,&bottom_blobs,&_woffset,piVar19,(int *)pMVar23,&_coffset,&_outw,&_outh,
                   &_outd,&_outc);
    iVar18 = (int)piVar19;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs);
    goto LAB_0025f427;
  }
  switch(bottom_blob->dims) {
  case 1:
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
    break;
  case 2:
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
    break;
  case 3:
    goto LAB_0025f25c;
  case 4:
LAB_0025f25c:
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
    break;
  default:
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  }
  bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  piVar19 = &_hoffset;
  pMVar23 = (Mat *)&_doffset;
  resolve_crop_roi(this,(Mat *)&bottom_blobs,&_woffset,piVar19,(int *)pMVar23,&_coffset,&_outw,
                   &_outh,&_outd,&_outc);
  iVar18 = (int)piVar19;
  piVar19 = (int *)CONCAT44(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish._4_4_,
                            bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish._0_4_);
  _elemsize = local_110;
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if ((*piVar19 == 0) &&
       (bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0)) {
      free(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start);
      _elemsize = local_110;
    }
  }
LAB_0025f427:
  iVar14 = _outc;
  iVar15 = (int)local_108;
  if (iVar15 != 3) {
    if (iVar15 == 2) {
      if (iVar2 != _outh || iVar1 != _outw) {
        Mat::create(top_blob,_outw,_outh,(size_t)_elemsize,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if (_elemsize == (Mat *)&DAT_00000004) {
LAB_0025fabb:
          copy_cut_border_image<float>(bottom_blob,top_blob,_hoffset,_woffset);
          return 0;
        }
        if (_elemsize == (Mat *)0x2) {
LAB_0025faa6:
          copy_cut_border_image<unsigned_short>(bottom_blob,top_blob,_hoffset,_woffset);
          return 0;
        }
        if (_elemsize != (Mat *)0x1) {
          return 0;
        }
LAB_0025f74d:
        copy_cut_border_image<signed_char>(bottom_blob,top_blob,_hoffset,_woffset);
        return 0;
      }
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar19 = bottom_blob->refcount;
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + 1;
        UNLOCK();
      }
      piVar19 = top_blob->refcount;
      if (piVar19 == (int *)0x0) goto LAB_0025fad4;
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 != 0) goto LAB_0025fad4;
      pvVar25 = top_blob->data;
      pAVar8 = top_blob->allocator;
    }
    else {
      if (iVar15 != 1) goto LAB_0025fc45;
      if (_outw != iVar1) {
        Mat::create(top_blob,_outw,(size_t)_elemsize,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if (_elemsize == (Mat *)&DAT_00000004) {
          _hoffset = 0;
          goto LAB_0025fabb;
        }
        if (_elemsize == (Mat *)0x2) {
          _hoffset = 0;
          goto LAB_0025faa6;
        }
        if (_elemsize != (Mat *)0x1) {
          return 0;
        }
        _hoffset = 0;
        goto LAB_0025f74d;
      }
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar19 = bottom_blob->refcount;
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + 1;
        UNLOCK();
      }
      piVar19 = top_blob->refcount;
      if (piVar19 == (int *)0x0) goto LAB_0025fad4;
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 != 0) goto LAB_0025fad4;
      pvVar25 = top_blob->data;
      pAVar8 = top_blob->allocator;
    }
    if (pAVar8 == (Allocator *)0x0) {
      if (pvVar25 != (void *)0x0) {
        free(pvVar25);
      }
    }
    else {
      (**(code **)(*(long *)pAVar8 + 0x18))();
    }
LAB_0025fad4:
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar19 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar19;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar1 = bottom_blob->w;
    iVar2 = bottom_blob->h;
    iVar3 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar1;
    top_blob->h = iVar2;
    top_blob->d = iVar3;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  if (_outc == iVar3 && (_outh == iVar2 && _outw == iVar1)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar19 = bottom_blob->refcount;
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + 1;
      UNLOCK();
    }
    piVar19 = top_blob->refcount;
    if (piVar19 == (int *)0x0) goto LAB_002600d7;
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 != 0) goto LAB_002600d7;
    pvVar25 = top_blob->data;
    pAVar8 = top_blob->allocator;
  }
  else {
    iVar15 = bottom_blob->w;
    pMVar23 = (Mat *)(long)iVar15;
    iVar20 = bottom_blob->h;
    iVar4 = bottom_blob->d;
    uVar9 = bottom_blob->elemsize;
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)_coffset * bottom_blob->cstep * uVar9 + (long)bottom_blob->data);
    iVar5 = bottom_blob->elempack;
    pAVar8 = bottom_blob->allocator;
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)uVar9;
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)(uVar9 >> 0x20);
    lVar24 = (long)iVar20 * (long)pMVar23;
    iVar6 = bottom_blob->dims;
    if (_outh != iVar2 || _outw != iVar1) {
      pMVar23 = _elemsize;
      Mat::create(top_blob,_outw,_outh,_outc,(size_t)_elemsize,opt->blob_allocator);
      iVar18 = -100;
      if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) {
        bVar10 = false;
      }
      else {
        bVar10 = true;
        if (0 < iVar14) {
          local_98 = (ulong)_woffset;
          local_a0 = (long)_hoffset;
          uVar16 = 0;
          do {
            lVar27 = (long)iVar15;
            m_1.elemsize = CONCAT44(bottom_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                    bottom_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
            m_1.data = (void *)((long)&(bottom_blobs.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->data +
                               (((long)iVar4 * uVar9 * lVar24 + 0xf & 0xfffffffffffffff0) / uVar9) *
                               uVar16 * m_1.elemsize);
            m_1.refcount = (int *)0x0;
            m_1.c = iVar4;
            m_1.d = 1;
            m_1.dims = iVar6 + -1;
            m_1.cstep = (m_1.elemsize * iVar20 * lVar27 + 0xf & 0xfffffffffffffff0) / m_1.elemsize;
            if (iVar6 == 4) {
              m_1.cstep = iVar20 * lVar27;
            }
            uVar7 = top_blob->w;
            lVar21 = (long)(int)uVar7;
            iVar18 = top_blob->h;
            m_2.elemsize = top_blob->elemsize;
            pvVar25 = (void *)(top_blob->cstep * uVar16 * m_2.elemsize + (long)top_blob->data);
            m_2.elempack = top_blob->elempack;
            m_2.allocator = top_blob->allocator;
            m_2.refcount = (int *)0x0;
            m_2.c = top_blob->d;
            m_2.d = 1;
            m_2.dims = top_blob->dims + -1;
            m_2.cstep = (m_2.elemsize * iVar18 * lVar21 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
            if (top_blob->dims == 4) {
              m_2.cstep = iVar18 * lVar21;
            }
            uVar26 = local_98;
            pMVar23 = top_blob;
            m_1.elempack = iVar5;
            m_1.allocator = pAVar8;
            m_1.w = iVar15;
            m_1.h = iVar20;
            local_b0 = uVar16;
            m_2.data = pvVar25;
            m_2.w = uVar7;
            m_2.h = iVar18;
            if (local_110 == (Mat *)&DAT_00000004) {
              copy_cut_border_image<float>(&m_1,&m_2,(int)local_a0,(int)local_98);
            }
            else if (local_110 == (Mat *)0x2) {
              copy_cut_border_image<unsigned_short>(&m_1,&m_2,(int)local_a0,(int)local_98);
            }
            else {
              uVar26 = m_1.elemsize;
              if ((local_110 == (Mat *)0x1) && (0 < iVar18)) {
                uVar26 = m_1.elemsize * lVar27 * local_a0 + local_98;
                pvVar22 = (void *)((long)m_1.data + uVar26);
                iVar28 = 0;
                local_90 = lVar21;
                do {
                  if ((int)lVar21 < 0xc) {
                    if (0 < (int)uVar7) {
                      uVar16 = 0;
                      do {
                        uVar26 = CONCAT71((int7)(uVar26 >> 8),
                                          *(undefined1 *)((long)pvVar22 + uVar16));
                        *(undefined1 *)((long)pvVar25 + uVar16) =
                             *(undefined1 *)((long)pvVar22 + uVar16);
                        uVar16 = uVar16 + 1;
                      } while (uVar7 != uVar16);
                    }
                  }
                  else {
                    memcpy(pvVar25,pvVar22,(ulong)uVar7);
                    lVar21 = local_90;
                  }
                  pvVar25 = (void *)((long)pvVar25 + lVar21);
                  pvVar22 = (void *)((long)pvVar22 + lVar27);
                  iVar28 = iVar28 + 1;
                } while (iVar28 != iVar18);
              }
            }
            iVar18 = (int)uVar26;
            uVar16 = local_b0 + 1;
          } while (uVar16 < (uint)iVar14);
          bVar10 = true;
          _elemsize = local_110;
        }
      }
    }
    else {
      Mat::clone(&m_1,(__fn *)&bottom_blobs,opt->blob_allocator,_outh,pMVar23);
      _elemsize = local_110;
      if (&m_1 != top_blob) {
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + 1;
          UNLOCK();
        }
        piVar19 = top_blob->refcount;
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 0x18))();
            }
          }
        }
        top_blob->data = m_1.data;
        top_blob->refcount = m_1.refcount;
        top_blob->elemsize = m_1.elemsize;
        top_blob->elempack = m_1.elempack;
        top_blob->allocator = m_1.allocator;
        top_blob->dims = m_1.dims;
        top_blob->w = m_1.w;
        top_blob->h = m_1.h;
        top_blob->d = m_1.d;
        top_blob->c = m_1.c;
        top_blob->cstep = m_1.cstep;
      }
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + -1;
        UNLOCK();
        if (*m_1.refcount == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (**(code **)(*(long *)m_1.allocator + 0x18))();
          }
        }
      }
      if (top_blob->data != (void *)0x0) {
        iVar18 = 0;
        bVar10 = false;
        if ((long)top_blob->c * top_blob->cstep != 0) goto LAB_0025fbf9;
      }
      iVar18 = -100;
      bVar10 = false;
    }
LAB_0025fbf9:
    piVar19 = (int *)CONCAT44(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                              ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                              bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                              ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if (pAVar8 == (Allocator *)0x0) {
          if (bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            free(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start);
          }
        }
        else {
          (**(code **)(*(long *)pAVar8 + 0x18))();
        }
      }
    }
    iVar15 = (int)local_108;
    if (!bVar10) {
      return iVar18;
    }
LAB_0025fc45:
    iVar14 = _outd;
    if (iVar15 != 4) {
      return 0;
    }
    local_b0 = CONCAT44(local_b0._4_4_,iVar18);
    bVar10 = (int)local_a8 == _outd;
    bVar11 = iVar2 == _outh;
    bVar12 = iVar1 == _outw;
    if (_outc != iVar3 || (!bVar10 || (!bVar11 || !bVar12))) {
      iVar1 = bottom_blob->w;
      iVar2 = bottom_blob->h;
      iVar3 = bottom_blob->d;
      uVar9 = bottom_blob->elemsize;
      bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)_coffset * bottom_blob->cstep * uVar9 + (long)bottom_blob->data);
      iVar15 = bottom_blob->elempack;
      pAVar8 = bottom_blob->allocator;
      bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)uVar9;
      bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)(uVar9 >> 0x20);
      if (bVar10 && (bVar11 && bVar12)) {
        Mat::clone(&m_1,(__fn *)&bottom_blobs,opt->blob_allocator,iVar18,
                   (void *)CONCAT71((int7)((ulong)pMVar23 >> 8),bVar10 && (bVar11 && bVar12)));
        if (&m_1 != top_blob) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar19 = top_blob->refcount;
          if (piVar19 != (int *)0x0) {
            LOCK();
            *piVar19 = *piVar19 + -1;
            UNLOCK();
            if (*piVar19 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          top_blob->data = m_1.data;
          top_blob->refcount = m_1.refcount;
          top_blob->elemsize = m_1.elemsize;
          top_blob->elempack = m_1.elempack;
          top_blob->allocator = m_1.allocator;
          top_blob->dims = m_1.dims;
          top_blob->w = m_1.w;
          top_blob->h = m_1.h;
          top_blob->d = m_1.d;
          top_blob->c = m_1.c;
          top_blob->cstep = m_1.cstep;
        }
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (**(code **)(*(long *)m_1.allocator + 0x18))();
            }
          }
        }
        if (top_blob->data != (void *)0x0) {
          iVar18 = 0;
          bVar10 = false;
          if ((long)top_blob->c * top_blob->cstep != 0) goto LAB_002601ef;
        }
        iVar18 = -100;
        bVar10 = false;
      }
      else {
        uVar16 = (ulong)(uint)_outd;
        Mat::create(top_blob,_outw,_outh,_outd,_outc,(size_t)_elemsize,opt->blob_allocator);
        iVar18 = (int)local_b0;
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) {
          bVar10 = false;
          iVar18 = -100;
        }
        else {
          bVar10 = true;
          if (0 < _outc) {
            local_a8 = (ulong)(uint)_outc;
            local_90 = (long)_doffset;
            local_140 = 0;
            do {
              if (0 < iVar14) {
                uVar26 = 0;
                do {
                  local_108 = (ulong)iVar1;
                  m_1.elemsize = CONCAT44(bottom_blobs.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                          bottom_blobs.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
                  m_1.cstep = (long)iVar2 * local_108;
                  m_1.data = (void *)((long)&(bottom_blobs.
                                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->data +
                                     ((int)uVar26 + local_90) * m_1.elemsize * m_1.cstep +
                                     (((long)iVar3 * uVar9 * (long)iVar2 * (long)iVar1 + 0xf &
                                      0xfffffffffffffff0) / uVar9) * local_140 * m_1.elemsize);
                  m_1.refcount = (int *)0x0;
                  m_1.dims = 2;
                  m_1.d = 1;
                  m_1.c = 1;
                  uVar7 = top_blob->w;
                  m_2.elemsize = top_blob->elemsize;
                  iVar18 = top_blob->h;
                  m_2.elempack = top_blob->elempack;
                  m_2.cstep = (long)iVar18 * (long)(int)uVar7;
                  pvVar25 = (void *)((long)top_blob->data +
                                    uVar26 * m_2.elemsize * m_2.cstep +
                                    top_blob->cstep * local_140 * m_2.elemsize);
                  m_2.allocator = top_blob->allocator;
                  m_2.refcount = (int *)0x0;
                  m_2.dims = 2;
                  m_2.d = 1;
                  m_2.c = 1;
                  m_1.elempack = iVar15;
                  m_1.allocator = pAVar8;
                  m_1.w = iVar1;
                  m_1.h = iVar2;
                  m_2.data = pvVar25;
                  m_2.w = uVar7;
                  m_2.h = iVar18;
                  if (local_110 == (Mat *)&DAT_00000004) {
                    copy_cut_border_image<float>(&m_1,&m_2,_hoffset,_woffset);
                  }
                  else if (local_110 == (Mat *)0x2) {
                    copy_cut_border_image<unsigned_short>(&m_1,&m_2,_hoffset,_woffset);
                  }
                  else if ((local_110 == (Mat *)0x1) && (0 < iVar18)) {
                    pvVar22 = (void *)((long)m_1.data +
                                      (long)_hoffset * local_108 * m_1.elemsize + (long)_woffset);
                    iVar20 = 0;
                    do {
                      if ((int)uVar7 < 0xc) {
                        if (0 < (int)uVar7) {
                          uVar17 = 0;
                          do {
                            *(undefined1 *)((long)pvVar25 + uVar17) =
                                 *(undefined1 *)((long)pvVar22 + uVar17);
                            uVar17 = uVar17 + 1;
                          } while (uVar7 != uVar17);
                        }
                      }
                      else {
                        memcpy(pvVar25,pvVar22,(ulong)uVar7);
                      }
                      pvVar25 = (void *)((long)pvVar25 + (long)(int)uVar7);
                      pvVar22 = (void *)((long)pvVar22 + local_108);
                      iVar20 = iVar20 + 1;
                    } while (iVar20 != iVar18);
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar26 < uVar16);
              }
              local_140 = local_140 + 1;
            } while (local_140 < local_a8);
            iVar18 = (int)local_b0;
            bVar10 = true;
          }
        }
      }
LAB_002601ef:
      piVar19 = (int *)CONCAT44(bottom_blobs.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                bottom_blobs.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (pAVar8 == (Allocator *)0x0) {
            if (bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              free(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start);
            }
          }
          else {
            (**(code **)(*(long *)pAVar8 + 0x18))();
          }
        }
      }
      if (bVar10) {
        return 0;
      }
      return iVar18;
    }
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar19 = bottom_blob->refcount;
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + 1;
      UNLOCK();
    }
    piVar19 = top_blob->refcount;
    if (piVar19 == (int *)0x0) goto LAB_002600d7;
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 != 0) goto LAB_002600d7;
    pvVar25 = top_blob->data;
    pAVar8 = top_blob->allocator;
  }
  if (pAVar8 == (Allocator *)0x0) {
    if (pvVar25 != (void *)0x0) {
      free(pvVar25);
    }
  }
  else {
    (**(code **)(*(long *)pAVar8 + 0x18))();
  }
LAB_002600d7:
  top_blob->cstep = 0;
  top_blob->data = (void *)0x0;
  top_blob->refcount = (int *)0x0;
  *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
  *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
  top_blob->dims = 0;
  top_blob->w = 0;
  top_blob->h = 0;
  top_blob->d = 0;
  top_blob->c = 0;
  piVar19 = bottom_blob->refcount;
  top_blob->data = bottom_blob->data;
  top_blob->refcount = piVar19;
  top_blob->elemsize = bottom_blob->elemsize;
  top_blob->elempack = bottom_blob->elempack;
  top_blob->allocator = bottom_blob->allocator;
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  iVar3 = bottom_blob->d;
  top_blob->dims = bottom_blob->dims;
  top_blob->w = iVar1;
  top_blob->h = iVar2;
  top_blob->d = iVar3;
  top_blob->c = bottom_blob->c;
  top_blob->cstep = bottom_blob->cstep;
  return 0;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _doffset, _coffset;
    int _outw = -1, _outh = -1, _outd = -1, _outc;

    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blobs(1);
        bottom_blobs[0] = bottom_blob;
        eval_crop_expr(bottom_blobs, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }
    }

    return 0;
}